

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O2

void __thiscall
PageStack<Memory::MarkContext::MarkCandidate>::Release
          (PageStack<Memory::MarkContext::MarkCandidate> *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  Chunk *chunk;
  undefined8 *in_FS_OFFSET;
  
  bVar3 = IsEmpty(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x187,"(IsEmpty())","IsEmpty()");
    if (!bVar3) goto LAB_002e824c;
    *puVar1 = 0;
  }
  chunk = this->currentChunk;
  if (chunk != (Chunk *)0x0) {
    if (chunk->nextChunk != (Chunk *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x18c,"(currentChunk->nextChunk == nullptr)",
                         "currentChunk->nextChunk == nullptr");
      if (!bVar3) {
LAB_002e824c:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
      chunk = this->currentChunk;
    }
    FreeChunk(this,chunk);
    this->currentChunk = (Chunk *)0x0;
  }
  this->nextEntry = (MarkCandidate *)0x0;
  this->chunkStart = (MarkCandidate *)0x0;
  this->chunkEnd = (MarkCandidate *)0x0;
  return;
}

Assistant:

void PageStack<T>::Release()
{
    Assert(IsEmpty());

    // We may have a preallocated chunk still held; if so release it.
    if (currentChunk != nullptr)
    {
        Assert(currentChunk->nextChunk == nullptr);
        FreeChunk(currentChunk);
        currentChunk = nullptr;
    }

    nextEntry = nullptr;
    chunkStart = nullptr;
    chunkEnd = nullptr;
}